

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O2

void __thiscall Palette::readSettings(Palette *this,QSettings *settings)

{
  undefined8 uVar1;
  long lVar2;
  QColor color;
  QString colorstr;
  anon_union_24_3_e3d07ef4_for_data local_88;
  undefined8 local_70;
  anon_union_24_3_e3d07ef4_for_data local_68;
  QArrayDataPointer<char16_t> local_48;
  
  QSettings::beginGroup((QString *)settings);
  lVar2 = 0;
  do {
    if (lVar2 == 0x1a0) {
      QSettings::endGroup();
      return;
    }
    local_88.shared = (PrivateShared *)0x0;
    local_88._8_8_ = 0;
    local_88._16_8_ = 0;
    local_70 = 2;
    QSettings::value((QString *)local_68.data,(QVariant *)settings);
    QVariant::toString();
    QVariant::~QVariant((QVariant *)&local_68);
    QVariant::~QVariant((QVariant *)&local_88);
    if (local_48.size == 0) {
LAB_0013f04e:
      uVar1 = *(undefined8 *)((long)&DAT_001a21b0 + lVar2);
      *(undefined8 *)((long)&(this->mData)._M_elems[0].cspec + lVar2) =
           *(undefined8 *)((long)&PaletteTU::ColorDefaults + lVar2);
      *(int *)((long)&(this->mData)._M_elems[0].ct + lVar2 + 4) = (int)uVar1;
      *(short *)((long)&(this->mData)._M_elems[0].ct + lVar2 + 8) = (short)((ulong)uVar1 >> 0x20);
    }
    else {
      QColor::setNamedColor((QString *)local_68.data);
      if (local_68._0_4_ == 0) goto LAB_0013f04e;
      QColor::setAlpha((int)&local_68);
      *(ulong *)((long)&(this->mData)._M_elems[0].ct + lVar2 + 2) =
           CONCAT62(local_68._8_6_,local_68._6_2_);
      *(ulong *)((long)&(this->mData)._M_elems[0].cspec + lVar2) =
           CONCAT26(local_68._6_2_,CONCAT24(local_68._4_2_,local_68._0_4_));
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    lVar2 = lVar2 + 0x10;
  } while( true );
}

Assistant:

void Palette::readSettings(QSettings &settings) {

    settings.beginGroup(Keys::Palette);

    for (int i = 0; i < ColorCount; ++i) {

        auto colorstr = settings.value(TU::ColorKeys[i]).toString();
        if (!colorstr.isEmpty()) {
            QColor color(colorstr);
            if (color.isValid()) {
                color.setAlpha(255); // sanitize
                mData[i] = color;
                continue; // success, do not load default
            }
        }
        // setting not found or was invalid
        // load the default
        mData[i] = getDefault((Color)i);
    }

    settings.endGroup();
}